

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDAApolynomialGetY(IDAMem IDA_mem,sunrealtype t,N_Vector yy,N_Vector yp,N_Vector *yyS,
                      N_Vector *ypS)

{
  int iVar1;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  IDAMem in_RDI;
  undefined8 in_R8;
  sunrealtype in_XMM0_Qa;
  double dVar2;
  double dVar3;
  sunrealtype Psiprime;
  sunrealtype Psi;
  sunrealtype factor;
  sunrealtype delt;
  int newpoint;
  long base;
  long index;
  int retval;
  int NS;
  int is;
  int j;
  int i;
  int order;
  int dir;
  int flag;
  IDApolynomialDataMem content;
  IDAdtpntMem *dt_mem;
  IDAadjMem IDAADJ_mem;
  int local_ac;
  double local_a8;
  double local_a0;
  int local_84;
  long local_80;
  long local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined8 *local_50;
  IDAdtpntMemRec **local_48;
  IDAadjMemRec *local_40;
  undefined8 local_38;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  sunrealtype local_18;
  IDAMem local_10;
  int local_4;
  
  local_40 = in_RDI->ida_adj_mem;
  local_48 = local_40->dt_mem;
  if ((local_40->ia_interpSensi == 0) || (in_RCX == 0)) {
    local_ac = 0;
  }
  else {
    local_ac = in_RDI->ida_Ns;
  }
  local_6c = local_ac;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  local_10 = in_RDI;
  local_54 = IDAAfindIndex(in_RDI,in_XMM0_Qa,&local_78,&local_84);
  local_4 = local_54;
  if (local_54 == 0) {
    if (local_78 == 0) {
      local_50 = (undefined8 *)(*local_48)->content;
      N_VScale(0x3ff0000000000000,*local_50,local_20);
      N_VScale(0x3ff0000000000000,local_50[2],local_28);
      if (0 < local_6c) {
        for (local_68 = 0; local_68 < local_6c; local_68 = local_68 + 1) {
          local_10->ida_cvals[local_68] = 1.0;
        }
        local_70 = N_VScaleVectorArray(local_6c,local_10->ida_cvals,local_50[1],local_30);
        if (local_70 != 0) {
          return -0x1c;
        }
        iVar1 = N_VScaleVectorArray(local_6c,local_10->ida_cvals,local_50[3],local_38);
        if (iVar1 != 0) {
          return -0x1c;
        }
      }
      local_4 = 0;
    }
    else {
      dVar2 = ABS(local_48[local_78]->t - local_48[local_78 + -1]->t);
      local_58 = -1;
      if (0.0 < local_40->ia_tfinal - local_40->ia_tinitial) {
        local_58 = 1;
      }
      if (local_58 == 1) {
        local_80 = local_78;
        local_50 = (undefined8 *)local_48[local_78]->content;
        local_5c = *(int *)(local_50 + 4);
        if (local_78 < local_5c) {
          local_80 = (long)local_5c;
        }
      }
      else {
        local_80 = local_78 + -1;
        local_50 = (undefined8 *)local_48[local_80]->content;
        local_5c = *(int *)(local_50 + 4);
        if ((long)local_5c < local_40->ia_np - local_78) {
          local_80 = local_80 - ((local_78 + local_5c) - local_40->ia_np);
        }
      }
      local_54 = 0;
      if (local_84 != 0) {
        if (local_58 == 1) {
          for (local_64 = 0; local_64 <= local_5c; local_64 = local_64 + 1) {
            local_40->ia_T[local_64] = local_48[local_80 - local_64]->t;
            local_50 = (undefined8 *)local_48[local_80 - local_64]->content;
            N_VScale(0x3ff0000000000000,*local_50,local_40->ia_Y[local_64]);
            if (0 < local_6c) {
              for (local_68 = 0; local_68 < local_6c; local_68 = local_68 + 1) {
                local_10->ida_cvals[local_68] = 1.0;
              }
              iVar1 = N_VScaleVectorArray(local_6c,local_10->ida_cvals,local_50[1],
                                          local_40->ia_YS[local_64]);
              if (iVar1 != 0) {
                return -0x1c;
              }
              local_70 = 0;
            }
          }
        }
        else {
          for (local_64 = 0; local_64 <= local_5c; local_64 = local_64 + 1) {
            local_40->ia_T[local_64] = local_48[local_80 + -1 + (long)local_64]->t;
            local_50 = (undefined8 *)local_48[local_80 + -1 + (long)local_64]->content;
            N_VScale(0x3ff0000000000000,*local_50,local_40->ia_Y[local_64]);
            if (0 < local_6c) {
              for (local_68 = 0; local_68 < local_6c; local_68 = local_68 + 1) {
                local_10->ida_cvals[local_68] = 1.0;
              }
              iVar1 = N_VScaleVectorArray(local_6c,local_10->ida_cvals,local_50[1],
                                          local_40->ia_YS[local_64]);
              if (iVar1 != 0) {
                return -0x1c;
              }
              local_70 = 0;
            }
          }
        }
        for (local_60 = 1; local_60 <= local_5c; local_60 = local_60 + 1) {
          for (local_64 = local_5c; local_60 <= local_64; local_64 = local_64 + -1) {
            dVar3 = dVar2 / (local_40->ia_T[local_64] - local_40->ia_T[local_64 - local_60]);
            N_VLinearSum(dVar3,-dVar3,local_40->ia_Y[local_64],local_40->ia_Y[local_64 + -1],
                         local_40->ia_Y[local_64]);
            for (local_68 = 0; local_68 < local_6c; local_68 = local_68 + 1) {
              N_VLinearSum(dVar3,-dVar3,local_40->ia_YS[local_64][local_68],
                           local_40->ia_YS[local_64 + -1][local_68],
                           local_40->ia_YS[local_64][local_68]);
            }
          }
        }
      }
      *local_10->ida_cvals = 1.0;
      for (local_60 = 0; local_60 < local_5c; local_60 = local_60 + 1) {
        local_10->ida_cvals[local_60 + 1] =
             (local_10->ida_cvals[local_60] * (local_18 - local_40->ia_T[local_60])) / dVar2;
      }
      local_70 = N_VLinearCombination(local_5c + 1,local_10->ida_cvals,local_40->ia_Y,local_20);
      if (local_70 == 0) {
        if ((local_6c < 1) ||
           (iVar1 = N_VLinearCombinationVectorArray
                              (local_6c,local_5c + 1,local_10->ida_cvals,local_40->ia_YS,local_30),
           iVar1 == 0)) {
          local_70 = 0;
          local_a0 = 1.0;
          local_a8 = 0.0;
          for (local_60 = 1; local_60 <= local_5c; local_60 = local_60 + 1) {
            dVar3 = (local_18 - local_40->ia_T[local_60 + -1]) / dVar2;
            local_a8 = dVar3 * local_a8 + local_a0 / dVar2;
            local_a0 = local_a0 * dVar3;
            local_10->ida_cvals[local_60 + -1] = local_a8;
          }
          local_70 = N_VLinearCombination(local_5c,local_10->ida_cvals,local_40->ia_Y + 1,local_28);
          if (local_70 == 0) {
            if ((local_6c < 1) ||
               (iVar1 = N_VLinearCombinationVectorArray
                                  (local_6c,local_5c,local_10->ida_cvals,local_40->ia_YS + 1,
                                   local_38), iVar1 == 0)) {
              local_4 = 0;
            }
            else {
              local_4 = -0x1c;
            }
          }
          else {
            local_4 = -0x1c;
          }
        }
        else {
          local_4 = -0x1c;
        }
      }
      else {
        local_4 = -0x1c;
      }
    }
  }
  return local_4;
}

Assistant:

static int IDAApolynomialGetY(IDAMem IDA_mem, sunrealtype t, N_Vector yy,
                              N_Vector yp, N_Vector* yyS, N_Vector* ypS)
{
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  IDApolynomialDataMem content;

  int flag, dir, order, i, j, is, NS, retval;
  long int index, base;
  sunbooleantype newpoint;
  sunrealtype delt, factor, Psi, Psiprime;

  IDAADJ_mem = IDA_mem->ida_adj_mem;
  dt_mem     = IDAADJ_mem->dt_mem;

  /* Local value of Ns */
  NS = (IDAADJ_mem->ia_interpSensi && (yyS != NULL)) ? IDA_mem->ida_Ns : 0;

  /* Get the index in dt_mem */
  flag = IDAAfindIndex(IDA_mem, t, &index, &newpoint);
  if (flag != IDA_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (index == 0)
  {
    content = (IDApolynomialDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content->y, yy);
    N_VScale(ONE, content->yd, yp);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }

      retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS, yyS);
      if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

      retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->ySd, ypS);
      if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
    }

    return (IDA_SUCCESS);
  }

  /* Scaling factor */
  delt = SUNRabs(dt_mem[index]->t - dt_mem[index - 1]->t);

  /* Find the direction of the forward integration */
  dir = (IDAADJ_mem->ia_tfinal - IDAADJ_mem->ia_tinitial > ZERO) ? 1 : -1;

  /* Establish the base point depending on the integration direction.
     Modify the base if there are not enough points for the current order */

  if (dir == 1)
  {
    base    = index;
    content = (IDApolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (index < order) { base += order - index; }
  }
  else
  {
    base    = index - 1;
    content = (IDApolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (IDAADJ_mem->ia_np - index > order)
    {
      base -= index + order - IDAADJ_mem->ia_np;
    }
  }

  /* Recompute Y (divided differences for Newton polynomial) if needed */

  if (newpoint)
  {
    /* Store 0-th order DD */
    if (dir == 1)
    {
      for (j = 0; j <= order; j++)
      {
        IDAADJ_mem->ia_T[j] = dt_mem[base - j]->t;
        content             = (IDApolynomialDataMem)(dt_mem[base - j]->content);
        N_VScale(ONE, content->y, IDAADJ_mem->ia_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS,
                                       IDAADJ_mem->ia_YS[j]);
          if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
        }
      }
    }
    else
    {
      for (j = 0; j <= order; j++)
      {
        IDAADJ_mem->ia_T[j] = dt_mem[base - 1 + j]->t;
        content = (IDApolynomialDataMem)(dt_mem[base - 1 + j]->content);
        N_VScale(ONE, content->y, IDAADJ_mem->ia_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS,
                                       IDAADJ_mem->ia_YS[j]);
          if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
        }
      }
    }

    /* Compute higher-order DD */
    for (i = 1; i <= order; i++)
    {
      for (j = order; j >= i; j--)
      {
        factor = delt / (IDAADJ_mem->ia_T[j] - IDAADJ_mem->ia_T[j - i]);
        N_VLinearSum(factor, IDAADJ_mem->ia_Y[j], -factor,
                     IDAADJ_mem->ia_Y[j - 1], IDAADJ_mem->ia_Y[j]);

        for (is = 0; is < NS; is++)
        {
          N_VLinearSum(factor, IDAADJ_mem->ia_YS[j][is], -factor,
                       IDAADJ_mem->ia_YS[j - 1][is], IDAADJ_mem->ia_YS[j][is]);
        }
      }
    }
  }

  /* Perform the actual interpolation for yy using nested multiplications */

  IDA_mem->ida_cvals[0] = ONE;
  for (i = 0; i < order; i++)
  {
    IDA_mem->ida_cvals[i + 1] = IDA_mem->ida_cvals[i] *
                                (t - IDAADJ_mem->ia_T[i]) / delt;
  }

  retval = N_VLinearCombination(order + 1, IDA_mem->ida_cvals, IDAADJ_mem->ia_Y,
                                yy);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order + 1, IDA_mem->ida_cvals,
                                             IDAADJ_mem->ia_YS, yyS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
  }

  /* Perform the actual interpolation for yp.

     Writing p(t) = y0 + (t-t0)*f[t0,t1] + ... + (t-t0)(t-t1)...(t-tn)*f[t0,t1,...tn],
     denote psi_k(t) = (t-t0)(t-t1)...(t-tk).

     The formula used for p'(t) is:
       - p'(t) = f[t0,t1] + psi_1'(t)*f[t0,t1,t2] + ... + psi_n'(t)*f[t0,t1,...,tn]

     We recursively compute psi_k'(t) from:
       - psi_k'(t) = (t-tk)*psi_{k-1}'(t) + psi_{k-1}

     psi_k is rescaled with 1/delt each time is computed, because the Newton DDs from Y were
     scaled with delt.
  */

  Psi      = ONE;
  Psiprime = ZERO;

  for (i = 1; i <= order; i++)
  {
    factor = (t - IDAADJ_mem->ia_T[i - 1]) / delt;

    Psiprime = Psi / delt + factor * Psiprime;
    Psi      = Psi * factor;

    IDA_mem->ida_cvals[i - 1] = Psiprime;
  }

  retval = N_VLinearCombination(order, IDA_mem->ida_cvals, IDAADJ_mem->ia_Y + 1,
                                yp);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order, IDA_mem->ida_cvals,
                                             IDAADJ_mem->ia_YS + 1, ypS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
  }

  return (IDA_SUCCESS);
}